

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::subSatUI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  uVar3 = (uint)(byte)((byte)iVar1 - (byte)iVar2);
  if ((byte)iVar1 < (byte)iVar2) {
    uVar3 = 0;
  }
  *(uint *)&__return_storage_ptr__->field_0 = uVar3;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSatUI8(const Literal& other) const {
  return Literal(sub_sat_u<uint8_t>(geti32(), other.geti32()));
}